

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugallocation.cc
# Opt level: O3

Ownership __thiscall
DebugMallocImplementation::GetOwnership(DebugMallocImplementation *this,void *p)

{
  ulong uVar1;
  MallocBlock *pMVar2;
  Ownership OVar3;
  
  OVar3 = kNotOwned;
  if (((p != (void *)0x0) && ((ulong)p >> 0x30 == 0)) &&
     ((uVar1 = (ulong)p >> 0xd,
      (uVar1 & 0xffffffffffff0000 ^
      *(ulong *)(tcmalloc::Static::pageheap_ + (uVar1 & 0xffff) * 8 + 0x10)) < 0x80 ||
      ((*(long *)(tcmalloc::Static::pageheap_ + ((ulong)p >> 0x1f) * 8 + 0x80010) != 0 &&
       (*(long *)(*(long *)(tcmalloc::Static::pageheap_ + ((ulong)p >> 0x1f) * 8 + 0x80010) +
                 (ulong)((uint)uVar1 & 0x3ffff) * 8) != 0)))))) {
    pMVar2 = MallocBlock::FromRawPointer(p);
    if (pMVar2 < (MallocBlock *)0x1000000000000) {
      uVar1 = (ulong)pMVar2 >> 0xd;
      OVar3 = kOwned;
      if ((0x7f < (uVar1 & 0x7ffffffff0000 ^
                  *(ulong *)(tcmalloc::Static::pageheap_ + (uVar1 & 0xffff) * 8 + 0x10))) &&
         ((*(long *)(tcmalloc::Static::pageheap_ + ((ulong)pMVar2 >> 0x1f) * 8 + 0x80010) == 0 ||
          (*(long *)(*(long *)(tcmalloc::Static::pageheap_ + ((ulong)pMVar2 >> 0x1f) * 8 + 0x80010)
                    + (ulong)((uint)uVar1 & 0x3ffff) * 8) == 0)))) {
        OVar3 = kNotOwned;
      }
    }
  }
  return OVar3;
}

Assistant:

virtual MallocExtension::Ownership GetOwnership(const void* p) {
    if (!p) {
      // nobody owns nullptr
      return MallocExtension::kNotOwned;
    }

    // FIXME: note that correct GetOwnership should not touch memory
    // that is not owned by tcmalloc. Main implementation is using
    // pagemap to discover if page in question is owned by us or
    // not. But pagemap only has marks for first and last page of
    // spans.  Note that if p was returned out of our memalign with
    // big alignment, then it will point outside of marked pages. Also
    // note that FromRawPointer call below requires touching memory
    // before pointer in order to handle memalign-ed chunks
    // (offset_). This leaves us with two options:
    //
    // * do FromRawPointer first and have possibility of crashing if
    //   we're given not owned pointer
    //
    // * return incorrect ownership for those large memalign chunks
    //
    // I've decided to choose later, which appears to happen rarer and
    // therefore is arguably a lesser evil

    MallocExtension::Ownership rv = TCMallocImplementation::GetOwnership(p);
    if (rv != MallocExtension::kOwned) {
      return rv;
    }

    if (tcmalloc::IsEmergencyPtr(p)) {
      return kOwned;
    }

    const MallocBlock* mb = MallocBlock::FromRawPointer(p);
    return TCMallocImplementation::GetOwnership(mb);
  }